

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O0

void Nwk_ObjTransferFanout(Nwk_Obj_t *pNodeFrom,Nwk_Obj_t *pNodeTo)

{
  Vec_Ptr_t *vNodes;
  int iVar1;
  int iVar2;
  int iVar3;
  Nwk_Obj_t *pObj;
  int local_30;
  int i;
  int nFanoutsOld;
  Nwk_Obj_t *pTemp;
  Vec_Ptr_t *vFanouts;
  Nwk_Obj_t *pNodeTo_local;
  Nwk_Obj_t *pNodeFrom_local;
  
  vNodes = pNodeFrom->pMan->vTemp;
  iVar1 = Nwk_ObjIsCo(pNodeFrom);
  if ((iVar1 != 0) || (iVar1 = Nwk_ObjIsCo(pNodeTo), iVar1 != 0)) {
    __assert_fail("!Nwk_ObjIsCo(pNodeFrom) && !Nwk_ObjIsCo(pNodeTo)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                  ,0x115,"void Nwk_ObjTransferFanout(Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pNodeFrom->pMan != pNodeTo->pMan) {
    __assert_fail("pNodeFrom->pMan == pNodeTo->pMan",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                  ,0x116,"void Nwk_ObjTransferFanout(Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pNodeFrom != pNodeTo) {
    iVar1 = Nwk_ObjFanoutNum(pNodeFrom);
    if (iVar1 < 1) {
      __assert_fail("Nwk_ObjFanoutNum(pNodeFrom) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                    ,0x118,"void Nwk_ObjTransferFanout(Nwk_Obj_t *, Nwk_Obj_t *)");
    }
    iVar1 = Nwk_ObjFanoutNum(pNodeTo);
    Nwk_ObjCollectFanouts(pNodeFrom,vNodes);
    for (local_30 = 0; iVar2 = Vec_PtrSize(vNodes), local_30 < iVar2; local_30 = local_30 + 1) {
      pObj = (Nwk_Obj_t *)Vec_PtrEntry(vNodes,local_30);
      Nwk_ObjPatchFanin(pObj,pNodeFrom,pNodeTo);
    }
    iVar2 = Nwk_ObjFanoutNum(pNodeFrom);
    if (iVar2 != 0) {
      __assert_fail("Nwk_ObjFanoutNum(pNodeFrom) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                    ,0x11f,"void Nwk_ObjTransferFanout(Nwk_Obj_t *, Nwk_Obj_t *)");
    }
    iVar2 = Nwk_ObjFanoutNum(pNodeTo);
    iVar3 = Vec_PtrSize(vNodes);
    if (iVar2 != iVar1 + iVar3) {
      __assert_fail("Nwk_ObjFanoutNum(pNodeTo) == nFanoutsOld + Vec_PtrSize(vFanouts)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                    ,0x120,"void Nwk_ObjTransferFanout(Nwk_Obj_t *, Nwk_Obj_t *)");
    }
    return;
  }
  __assert_fail("pNodeFrom != pNodeTo",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                ,0x117,"void Nwk_ObjTransferFanout(Nwk_Obj_t *, Nwk_Obj_t *)");
}

Assistant:

void Nwk_ObjTransferFanout( Nwk_Obj_t * pNodeFrom, Nwk_Obj_t * pNodeTo )
{
    Vec_Ptr_t * vFanouts = pNodeFrom->pMan->vTemp;
    Nwk_Obj_t * pTemp;
    int nFanoutsOld, i;
    assert( !Nwk_ObjIsCo(pNodeFrom) && !Nwk_ObjIsCo(pNodeTo) );
    assert( pNodeFrom->pMan == pNodeTo->pMan );
    assert( pNodeFrom != pNodeTo );
    assert( Nwk_ObjFanoutNum(pNodeFrom) > 0 );
    // get the fanouts of the old node
    nFanoutsOld = Nwk_ObjFanoutNum(pNodeTo);
    Nwk_ObjCollectFanouts( pNodeFrom, vFanouts );
    // patch the fanin of each of them
    Vec_PtrForEachEntry( Nwk_Obj_t *, vFanouts, pTemp, i )
        Nwk_ObjPatchFanin( pTemp, pNodeFrom, pNodeTo );
    assert( Nwk_ObjFanoutNum(pNodeFrom) == 0 );
    assert( Nwk_ObjFanoutNum(pNodeTo) == nFanoutsOld + Vec_PtrSize(vFanouts) );
}